

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O2

void Wlc_WinCleanMark_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int Id;
  Wlc_Obj_t *pObj_00;
  int i;
  
  if ((char)*(ushort *)pObj < '\0') {
    *(ushort *)pObj = *(ushort *)pObj & 0xff7f;
    for (i = 0; i < (int)pObj->nFanins; i = i + 1) {
      Id = Wlc_ObjFaninId(pObj,i);
      pObj_00 = Wlc_NtkObj(p,Id);
      Wlc_WinCleanMark_rec(p,pObj_00);
    }
  }
  return;
}

Assistant:

void Wlc_WinCleanMark_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    Wlc_Obj_t * pFanin;  int i;
    if ( !pObj->Mark )
        return;
    pObj->Mark = 0;
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        Wlc_WinCleanMark_rec( p, pFanin );
}